

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<11,_5,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  float *pfVar1;
  long lVar2;
  undefined4 *puVar3;
  long lVar4;
  bool bVar5;
  undefined4 uVar6;
  Vector<float,_3> res;
  Type in0;
  float afStack_98 [6];
  float local_80 [6];
  Matrix<float,_2,_2> local_68;
  int local_50 [6];
  float local_38;
  float local_34;
  undefined4 local_30;
  float local_2c;
  undefined4 local_28;
  float local_24;
  undefined4 local_20;
  float local_1c;
  
  pfVar1 = (float *)&local_68;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        uVar6 = 0x3f800000;
        if (lVar2 != lVar4) {
          uVar6 = 0;
        }
        pfVar1[lVar4 * 2] = (float)uVar6;
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
      pfVar1 = pfVar1 + 1;
      bVar5 = lVar2 == 0;
      lVar2 = lVar2 + 1;
    } while (bVar5);
    local_68.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    local_68.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
  }
  else {
    local_68.m_data.m_data[0].m_data[0] = 0.0;
    local_68.m_data.m_data[0].m_data[1] = 0.0;
    local_68.m_data.m_data[1].m_data[0] = 0.0;
    local_68.m_data.m_data[1].m_data[1] = 0.0;
    puVar3 = &sr::(anonymous_namespace)::s_constInMat2x2;
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        pfVar1[lVar4 * 2] = (float)puVar3[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
      pfVar1 = pfVar1 + 1;
      puVar3 = puVar3 + 2;
      bVar5 = lVar2 == 0;
      lVar2 = lVar2 + 1;
    } while (bVar5);
  }
  sr::(anonymous_namespace)::MatrixCaseUtils::increment<float,2,2>
            ((MatrixCaseUtils *)&local_28,&local_68);
  local_80[5] = local_24 + local_1c;
  local_80[3] = (float)local_28;
  local_80[4] = (float)local_20;
  sr::(anonymous_namespace)::MatrixCaseUtils::increment<float,2,2>
            ((MatrixCaseUtils *)&local_38,&local_68);
  local_80[0] = local_38;
  local_80[1] = (float)local_30;
  local_80[2] = local_34 + local_2c;
  afStack_98[2] = 0.0;
  afStack_98[3] = 0.0;
  afStack_98[4] = 0.0;
  lVar2 = 0;
  do {
    afStack_98[lVar2 + 2] = local_80[lVar2 + 3] + local_80[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_50[2] = 0;
  local_50[3] = 1;
  local_50[4] = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[local_50[lVar2]] = afStack_98[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(increment(in0)) + reduceToVec3(increment(in0));
	}